

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

LPCSTR NpyArray::ParseHeaderNPY
                 (FILE *fp,shape_t *shape,size_t *wordSize,char *type,bool *fortranOrder)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  void *__ptr;
  allocator local_81;
  undefined1 local_80 [8];
  string header;
  char local_58;
  char acStack_57 [3];
  uint32_t lenHeader;
  char buffer [32];
  bool *fortranOrder_local;
  char *type_local;
  size_t *wordSize_local;
  shape_t *shape_local;
  FILE *fp_local;
  
  buffer._24_8_ = fortranOrder;
  sVar2 = fread(&local_58,1,10,(FILE *)fp);
  if (((sVar2 == 10) && (local_58 == -0x6d)) && (iVar1 = strncmp(acStack_57,"NUMPY",5), iVar1 == 0))
  {
    if (lenHeader._2_1_ < '\x02') {
      header.field_2._12_4_ = ((int)buffer[1] & 0xffffU) << 8 | (int)buffer[0] & 0xffffU;
    }
    else {
      fread(buffer + 2,1,2,(FILE *)fp);
      header.field_2._12_4_ =
           (int)buffer[3] << 0x18 | (int)buffer[2] << 0x10 | (int)buffer[1] << 8 | (int)buffer[0];
    }
    uVar3 = (ulong)(uint)header.field_2._12_4_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_80,uVar3,'\0',&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    __ptr = (void *)std::__cxx11::string::operator[]((ulong)local_80);
    sVar2 = fread(__ptr,1,(ulong)(uint)header.field_2._12_4_,(FILE *)fp);
    if (sVar2 == (uint)header.field_2._12_4_) {
      fp_local = (FILE *)ParseHeaderNPY((string *)local_80,shape,wordSize,type,(bool *)buffer._24_8_
                                       );
    }
    else {
      fp_local = (FILE *)anon_var_dwarf_11c;
    }
    std::__cxx11::string::~string((string *)local_80);
    return (LPCSTR)fp_local;
  }
  return "error: invalid header id";
}

Assistant:

LPCSTR NpyArray::ParseHeaderNPY(FILE* fp, shape_t& shape, size_t& wordSize, char& type, bool& fortranOrder)
{
	char buffer[32];
	if (fread(buffer, sizeof(char), 10, fp) != 10 ||
		buffer[0] != (char)0x93 || _tcsncmp(buffer+1, "NUMPY", 5) != 0)
		return "error: invalid header id";
	// parse the length of the header data
	uint32_t lenHeader;
	ASSERT(buffer[7] >= 0); // minor version number of the file format
	if (buffer[6] > 1) { // major version number of the file format
		// little-endian unsigned int
		fread(buffer+10, sizeof(char), 2, fp);
		lenHeader = (uint32_t(buffer[11])<<24)|(uint32_t(buffer[10])<<16)|(uint32_t(buffer[9])<<8)|uint32_t(buffer[8]);
	} else {
		// little-endian unsigned short int
		lenHeader = (uint16_t(buffer[9])<<8)|uint16_t(buffer[8]);
	}
	std::string header(lenHeader, '\0');
	if (fread(&header[0], sizeof(char), lenHeader, fp) != lenHeader)
		return "error: invalid header";
	return ParseHeaderNPY(header, shape, wordSize, type, fortranOrder);
}